

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O1

int __thiscall QPixmap::copy(QPixmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  undefined1 auVar2 [16];
  QPlatformPixmap *d;
  long in_FS_OFFSET;
  int iVar4;
  undefined1 auVar3 [16];
  QRect QVar5;
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(dst + 0x10);
  if ((lVar1 == 0) || (*(char *)(lVar1 + 0x14) == '\x01')) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_002b0ab0;
    QPixmap(this);
  }
  else {
    local_38.y2.m_i = -1;
    local_38.x2.m_i = -1;
    if (lVar1 != 0) {
      local_38.x2.m_i = *(int *)(lVar1 + 8) + -1;
      local_38.y2.m_i = *(int *)(lVar1 + 0xc) + -1;
    }
    local_38.x1.m_i = 0;
    local_38.y1.m_i = 0;
    auVar2._8_8_ = 0;
    auVar2._0_4_ = local_38.x2.m_i;
    auVar2._4_4_ = local_38.y2.m_i;
    QVar5 = (QRect)(auVar2 << 0x40);
    auVar3._0_4_ = -(uint)((int)*(undefined8 *)(src + 8) < (int)*(undefined8 *)src);
    iVar4 = -(uint)((int)((ulong)*(undefined8 *)(src + 8) >> 0x20) <
                   (int)((ulong)*(undefined8 *)src >> 0x20));
    auVar3._4_4_ = auVar3._0_4_;
    auVar3._8_4_ = iVar4;
    auVar3._12_4_ = iVar4;
    iVar4 = movmskpd((int)lVar1,auVar3);
    if (iVar4 == 0) {
      QVar5 = (QRect)QRect::operator&(&local_38,(QRect *)src);
    }
    local_38 = QVar5;
    d = (QPlatformPixmap *)(**(code **)(**(long **)(dst + 0x10) + 0x10))();
    (*d->_vptr_QPlatformPixmap[9])(d,*(undefined8 *)(dst + 0x10),&local_38);
    QPixmap(this,d);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_002b0ab0:
      __stack_chk_fail();
    }
  }
  return (int)this;
}

Assistant:

QPixmap QPixmap::copy(const QRect &rect) const
{
    if (isNull())
        return QPixmap();

    QRect r(0, 0, width(), height());
    if (!rect.isEmpty())
        r = r.intersected(rect);

    QPlatformPixmap *d = data->createCompatiblePlatformPixmap();
    d->copy(data.data(), r);
    return QPixmap(d);
}